

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O2

streamsize __thiscall
stream::inno_exe_decoder_5200::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_5200 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  type tVar4;
  streamsize sVar5;
  uint uVar6;
  long lVar7;
  uint32_t uVar8;
  uint8_t *__src;
  uint8_t *puVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  
  cVar3 = this->flush_bytes;
  puVar11 = (uint8_t *)dest;
  if ('\0' < cVar3) {
    lVar7 = 0;
    do {
      if (n == lVar7) {
        __src = this->buffer + n;
        goto LAB_00144c5b;
      }
      lVar1 = lVar7 + 1;
      dest[lVar7] = this->buffer[lVar7];
      cVar3 = this->flush_bytes + -1;
      this->flush_bytes = cVar3;
      lVar7 = lVar1;
    } while (cVar3 != '\0');
    puVar11 = (uint8_t *)(dest + lVar1);
  }
  puVar12 = (uint8_t *)(dest + n);
  puVar9 = this->buffer;
  do {
    if ((long)puVar11 - (long)puVar12 == 0) {
      return n;
    }
    cVar3 = this->flush_bytes;
    if (cVar3 != '\0') goto LAB_00144ba6;
    tVar4 = boost::iostreams::detail::read_device_impl<boost::iostreams::streambuf_tag>::
            get<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>(src);
    if (tVar4 == -2) goto LAB_00144c72;
    if (tVar4 == -1) {
      uVar10 = ((long)puVar11 - (long)puVar12) + n;
      return -(ulong)(uVar10 == 0) | uVar10;
    }
    *puVar11 = (uint8_t)tVar4;
    puVar11 = puVar11 + 1;
    uVar6 = this->offset;
    this->offset = uVar6 + 1;
    if ((~uVar6 & 0xfffc) != 0 && 0xfffffffd < tVar4 - 0xeaU) {
      this->flush_bytes = -4;
      cVar3 = -4;
LAB_00144ba6:
      sVar5 = boost::iostreams::detail::read_device_impl<boost::iostreams::streambuf_tag>::
              read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                        (src,(type *)(this->buffer + (long)cVar3 + 4),-(long)cVar3);
      if (sVar5 == -1) {
        cVar3 = this->flush_bytes + '\x04';
        if ('\0' < cVar3) {
          this->flush_bytes = cVar3;
          do {
            __src = puVar9;
            if (puVar11 == puVar12) {
LAB_00144c5b:
              memmove(this->buffer,__src,(long)cVar3);
              return n;
            }
            *puVar11 = *puVar9;
            puVar11 = puVar11 + 1;
            puVar9 = puVar9 + 1;
            cVar3 = this->flush_bytes + -1;
            this->flush_bytes = cVar3;
          } while (cVar3 != '\0');
        }
        return -(ulong)(puVar11 + (n - (long)puVar12) == (uint8_t *)0x0) |
               (ulong)(puVar11 + (n - (long)puVar12));
      }
      uVar8 = (int)sVar5 + this->offset;
      cVar3 = this->flush_bytes + (char)sVar5;
      this->flush_bytes = cVar3;
      this->offset = uVar8;
      if (cVar3 != '\0') {
LAB_00144c72:
        return (streamsize)(puVar11 + (n - (long)puVar12));
      }
      bVar2 = this->buffer[3];
      if ((bVar2 == 0xff) || (bVar2 == 0)) {
        uVar6 = *(uint3 *)this->buffer - uVar8;
        this->buffer[0] = (uint8_t)uVar6;
        this->buffer[1] = (uint8_t)(uVar6 >> 8);
        this->buffer[2] = (uint8_t)(uVar6 >> 0x10);
        if ((this->flip_high_byte == true) && ((uVar6 & 0x800000) != 0)) {
          this->buffer[3] = ~bVar2;
        }
      }
      this->flush_bytes = '\x04';
      cVar3 = '\x04';
      __src = puVar9;
      do {
        if (puVar11 == puVar12) goto LAB_00144c5b;
        *puVar11 = *__src;
        puVar11 = puVar11 + 1;
        __src = __src + 1;
        cVar3 = this->flush_bytes + -1;
        this->flush_bytes = cVar3;
      } while (cVar3 != '\0');
    }
  } while( true );
}

Assistant:

std::streamsize inno_exe_decoder_5200::read(Source & src, char * dest, std::streamsize n) {
	
	char * end = dest + n;
	
	//! Total number of filtered bytes read and written to dest.
#define total_read     (n - (end - dest))
	
#define flush(N) \
	{ \
		if((N) > 0) { \
			flush_bytes = (N); \
			size_t buffer_i = 0; \
			do { \
				if(dest == end) { \
					memmove(buffer, buffer + buffer_i, size_t(flush_bytes)); \
					return total_read; \
				} \
				*dest++ = char(buffer[buffer_i++]); \
			} while(--flush_bytes); \
		} \
	} (void)0
	
	
	// Flush already processed address bytes.
	flush(flush_bytes);
	
	while(dest != end) {
		
		if(!flush_bytes) {
			
			// Check if this is a CALL or JMP instruction.
			int byte = boost::iostreams::get(src);
			if(byte == EOF) { return total_read ? total_read : EOF; }
			if(byte == boost::iostreams::WOULD_BLOCK) { return total_read; }
			*dest++ = char(byte);
			offset++;
			if(byte != 0xe8 && byte != 0xe9) {
				// Not a CALL or JMP instruction.
				continue;
			}
			
			const size_t block_size_left = block_size - ((offset - 1) % block_size);
			if(block_size_left < 5) {
				// Ignore instructions that span blocks.
				continue;
			}
			
			flush_bytes = -4;
		}
		
		assert(flush_bytes < 0);
		
		// Read all four address bytes.
		char * dst = reinterpret_cast<char *>(buffer + 4 + flush_bytes);
		std::streamsize nread = boost::iostreams::read(src, dst, -flush_bytes);
		if(nread == EOF) {
			flush(boost::int8_t(4 + flush_bytes));
			return total_read ? total_read : EOF;
		}
		flush_bytes = boost::int8_t(flush_bytes + nread), offset += boost::uint32_t(nread);
		if(flush_bytes) { return total_read; }
		
		// Verify that the high byte of the address is 0x00 or 00xff.
		if(buffer[3] == 0x00 || buffer[3] == 0xff) {
			
			boost::uint32_t addr = offset & 0xffffff; // may wrap, but OK
			
			boost::uint32_t rel = buffer[0] | (boost::uint32_t(buffer[1]) << 8)
			                                | (boost::uint32_t(buffer[2]) << 16);
			rel -= addr;
			buffer[0] = boost::uint8_t(rel);
			buffer[1] = boost::uint8_t(rel >> 8);
			buffer[2] = boost::uint8_t(rel >> 16);
			
			if(flip_high_byte) {
				// For a slightly higher compression ratio, we want the resulting high
				// byte to be 0x00 for both forward and backward jumps. The high byte
				// of the original relative address is likely to be the sign extension
				// of bit 23, so if bit 23 is set, toggle all bits in the high byte.
				if(rel & 0x800000) {
					buffer[3] = boost::uint8_t(~buffer[3]);
				}
			}
			
		} else {
			// This is most likely not a CALL or JUMP.
		}
		
		flush(4);
	}
	
	return total_read;
	
#undef flush
#undef total_read
	
}